

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O0

void __thiscall
t_cpp_generator::generate_service_async_skeleton(t_cpp_generator *this,t_service *tservice)

{
  t_function *ptVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  undefined4 extraout_var;
  t_program *ptVar5;
  char *pcVar6;
  ostream *poVar7;
  ulong uVar8;
  long lVar9;
  vector<t_function_*,_std::allocator<t_function_*>_> *__x;
  string *psVar10;
  reference pptVar11;
  t_type *type;
  int __oflag;
  string local_8f0;
  string local_8d0;
  string local_8b0;
  string local_890;
  string local_870;
  string local_850;
  string local_830;
  string local_810;
  string local_7f0;
  string local_7d0;
  string local_7b0;
  allocator local_789;
  string local_788;
  allocator local_761;
  string local_760;
  string local_740;
  string local_720;
  string local_700;
  allocator local_6d9;
  string local_6d8 [8];
  string target;
  string local_6b0;
  undefined1 local_690 [8];
  t_field returnfield;
  t_type *returntype;
  string local_5d0;
  allocator local_5a9;
  string local_5a8;
  string local_588;
  string local_568;
  __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
  local_548;
  t_function **local_540;
  string local_538;
  string local_518;
  string local_4f8;
  string local_4d8;
  string local_4b8;
  string local_498;
  string local_478;
  string local_458;
  allocator local_431;
  string local_430;
  allocator local_409;
  string local_408;
  string local_3e8;
  string local_3c8;
  __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
  local_3a8;
  t_function **local_3a0;
  __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
  local_398;
  iterator f_iter;
  vector<t_function_*,_std::allocator<t_function_*>_> functions;
  string local_358;
  string local_338;
  string local_318 [32];
  string local_2f8;
  allocator local_2d1;
  string local_2d0 [32];
  undefined1 local_2b0 [8];
  ofstream_with_content_based_conditional_update f_skeleton;
  string local_108;
  string local_e8;
  undefined1 local_c8 [8];
  string ns;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  undefined1 local_58 [8];
  string f_skeleton_name;
  string svcname;
  t_service *tservice_local;
  t_cpp_generator *this_local;
  
  iVar4 = (*(tservice->super_t_type).super_t_doc._vptr_t_doc[3])();
  std::__cxx11::string::string
            ((string *)(f_skeleton_name.field_2._M_local_buf + 8),
             (string *)CONCAT44(extraout_var,iVar4));
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1b])(&local_98);
  std::operator+(&local_78,&local_98,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&f_skeleton_name.field_2 + 8));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                 &local_78,"_async_server.skeleton.cpp");
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  ptVar5 = t_type::get_program(&tservice->super_t_type);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_108,"cpp",(allocator *)&f_skeleton.field_0x19f);
  t_program::get_namespace(&local_e8,ptVar5,&local_108);
  namespace_prefix((string *)local_c8,this,&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::~allocator((allocator<char> *)&f_skeleton.field_0x19f);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
  template_ofstream_with_content_based_conditional_update
            ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
              *)local_2b0);
  pcVar6 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2d0,pcVar6,&local_2d1);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::open
            ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
              *)local_2b0,(char *)local_2d0,__oflag);
  std::__cxx11::string::~string(local_2d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2d1);
  poVar7 = std::operator<<((ostream *)local_2b0,
                           "// This autogenerated skeleton file illustrates one way to adapt a synchronous"
                          );
  poVar7 = std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
  poVar7 = std::operator<<(poVar7,
                           "// interface into an asynchronous interface. You should copy it to another"
                          );
  poVar7 = std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
  poVar7 = std::operator<<(poVar7,
                           "// filename to avoid overwriting it and rewrite as asynchronous any functions"
                          );
  poVar7 = std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
  poVar7 = std::operator<<(poVar7,"// that would otherwise introduce unwanted latency.");
  poVar7 = std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
  poVar7 = std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
  poVar7 = std::operator<<(poVar7,"#include \"");
  ptVar5 = t_generator::get_program((t_generator *)this);
  get_include_prefix_abi_cxx11_(&local_2f8,this,ptVar5);
  poVar7 = std::operator<<(poVar7,(string *)&local_2f8);
  poVar7 = std::operator<<(poVar7,(string *)(f_skeleton_name.field_2._M_local_buf + 8));
  poVar7 = std::operator<<(poVar7,".h\"");
  poVar7 = std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
  poVar7 = std::operator<<(poVar7,"#include <thrift/protocol/TBinaryProtocol.h>");
  poVar7 = std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
  poVar7 = std::operator<<(poVar7,"#include <thrift/async/TAsyncProtocolProcessor.h>");
  poVar7 = std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
  poVar7 = std::operator<<(poVar7,"#include <thrift/async/TEvhttpServer.h>");
  poVar7 = std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
  poVar7 = std::operator<<(poVar7,"#include <event.h>");
  poVar7 = std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
  poVar7 = std::operator<<(poVar7,"#include <evhttp.h>");
  poVar7 = std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
  poVar7 = std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
  poVar7 = std::operator<<(poVar7,"using namespace ::apache::thrift;");
  poVar7 = std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
  poVar7 = std::operator<<(poVar7,"using namespace ::apache::thrift::protocol;");
  poVar7 = std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
  poVar7 = std::operator<<(poVar7,"using namespace ::apache::thrift::transport;");
  poVar7 = std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
  poVar7 = std::operator<<(poVar7,"using namespace ::apache::thrift::async;");
  poVar7 = std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_2f8);
  uVar8 = std::__cxx11::string::empty();
  if ((uVar8 & 1) == 0) {
    iVar4 = std::__cxx11::string::compare(local_c8);
    if (iVar4 != 0) {
      poVar7 = std::operator<<((ostream *)local_2b0,"using namespace ");
      lVar9 = std::__cxx11::string::size();
      std::__cxx11::string::string(local_318,(string *)local_c8,0,lVar9 - 2);
      poVar7 = std::operator<<(poVar7,local_318);
      poVar7 = std::operator<<(poVar7,";");
      poVar7 = std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
      std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string(local_318);
    }
  }
  poVar7 = std::operator<<((ostream *)local_2b0,"class ");
  poVar7 = std::operator<<(poVar7,(string *)(f_skeleton_name.field_2._M_local_buf + 8));
  poVar7 = std::operator<<(poVar7,"Handler : virtual public ");
  poVar7 = std::operator<<(poVar7,(string *)(f_skeleton_name.field_2._M_local_buf + 8));
  poVar7 = std::operator<<(poVar7,"If {");
  poVar7 = std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
  poVar7 = std::operator<<(poVar7," public:");
  std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
  t_generator::indent_up((t_generator *)this);
  t_generator::indent_abi_cxx11_(&local_338,(t_generator *)this);
  poVar7 = std::operator<<((ostream *)local_2b0,(string *)&local_338);
  poVar7 = std::operator<<(poVar7,(string *)(f_skeleton_name.field_2._M_local_buf + 8));
  poVar7 = std::operator<<(poVar7,"Handler() {");
  poVar7 = std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_358,(t_generator *)this);
  poVar7 = std::operator<<(poVar7,(string *)&local_358);
  poVar7 = std::operator<<(poVar7,"  // Your initialization goes here");
  poVar7 = std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_
            ((string *)
             &functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(t_generator *)this);
  poVar7 = std::operator<<(poVar7,(string *)
                                  &functions.
                                   super__Vector_base<t_function_*,_std::allocator<t_function_*>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage);
  poVar7 = std::operator<<(poVar7,"}");
  poVar7 = std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string
            ((string *)
             &functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)&local_358);
  std::__cxx11::string::~string((string *)&local_338);
  __x = t_service::get_functions(tservice);
  std::vector<t_function_*,_std::allocator<t_function_*>_>::vector
            ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter,__x);
  __gnu_cxx::
  __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>::
  __normal_iterator(&local_398);
  local_3a0 = (t_function **)
              std::vector<t_function_*,_std::allocator<t_function_*>_>::begin
                        ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter);
  local_398._M_current = local_3a0;
  while( true ) {
    local_3a8._M_current =
         (t_function **)
         std::vector<t_function_*,_std::allocator<t_function_*>_>::end
                   ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter);
    bVar2 = __gnu_cxx::operator!=(&local_398,&local_3a8);
    if (!bVar2) break;
    pptVar11 = __gnu_cxx::
               __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
               ::operator*(&local_398);
    (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x23])
              (this,local_2b0,*pptVar11);
    t_generator::indent_abi_cxx11_(&local_3c8,(t_generator *)this);
    poVar7 = std::operator<<((ostream *)local_2b0,(string *)&local_3c8);
    pptVar11 = __gnu_cxx::
               __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
               ::operator*(&local_398);
    ptVar1 = *pptVar11;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_408,"",&local_409);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_430,"",&local_431);
    function_signature(&local_3e8,this,ptVar1,&local_408,&local_430,true);
    poVar7 = std::operator<<(poVar7,(string *)&local_3e8);
    poVar7 = std::operator<<(poVar7," {");
    poVar7 = std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_458,(t_generator *)this);
    poVar7 = std::operator<<(poVar7,(string *)&local_458);
    poVar7 = std::operator<<(poVar7,"  // Your implementation goes here");
    poVar7 = std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_478,(t_generator *)this);
    poVar7 = std::operator<<(poVar7,(string *)&local_478);
    poVar7 = std::operator<<(poVar7,"  printf(\"");
    pptVar11 = __gnu_cxx::
               __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
               ::operator*(&local_398);
    psVar10 = t_function::get_name_abi_cxx11_(*pptVar11);
    poVar7 = std::operator<<(poVar7,(string *)psVar10);
    poVar7 = std::operator<<(poVar7,"\\n\");");
    poVar7 = std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_498,(t_generator *)this);
    poVar7 = std::operator<<(poVar7,(string *)&local_498);
    poVar7 = std::operator<<(poVar7,"}");
    poVar7 = std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_498);
    std::__cxx11::string::~string((string *)&local_478);
    std::__cxx11::string::~string((string *)&local_458);
    std::__cxx11::string::~string((string *)&local_3e8);
    std::__cxx11::string::~string((string *)&local_430);
    std::allocator<char>::~allocator((allocator<char> *)&local_431);
    std::__cxx11::string::~string((string *)&local_408);
    std::allocator<char>::~allocator((allocator<char> *)&local_409);
    std::__cxx11::string::~string((string *)&local_3c8);
    __gnu_cxx::
    __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>::
    operator++(&local_398);
  }
  t_generator::indent_down((t_generator *)this);
  poVar7 = std::operator<<((ostream *)local_2b0,"};");
  poVar7 = std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
  poVar7 = std::operator<<((ostream *)local_2b0,"class ");
  poVar7 = std::operator<<(poVar7,(string *)(f_skeleton_name.field_2._M_local_buf + 8));
  poVar7 = std::operator<<(poVar7,"AsyncHandler : ");
  poVar7 = std::operator<<(poVar7,"public ");
  poVar7 = std::operator<<(poVar7,(string *)(f_skeleton_name.field_2._M_local_buf + 8));
  poVar7 = std::operator<<(poVar7,"CobSvIf {");
  poVar7 = std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
  poVar7 = std::operator<<(poVar7," public:");
  std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
  t_generator::indent_up((t_generator *)this);
  t_generator::indent_abi_cxx11_(&local_4b8,(t_generator *)this);
  poVar7 = std::operator<<((ostream *)local_2b0,(string *)&local_4b8);
  poVar7 = std::operator<<(poVar7,(string *)(f_skeleton_name.field_2._M_local_buf + 8));
  poVar7 = std::operator<<(poVar7,"AsyncHandler() {");
  poVar7 = std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_4d8,(t_generator *)this);
  poVar7 = std::operator<<(poVar7,(string *)&local_4d8);
  poVar7 = std::operator<<(poVar7,"  syncHandler_ = std::unique_ptr<");
  poVar7 = std::operator<<(poVar7,(string *)(f_skeleton_name.field_2._M_local_buf + 8));
  poVar7 = std::operator<<(poVar7,"Handler>(new ");
  poVar7 = std::operator<<(poVar7,(string *)(f_skeleton_name.field_2._M_local_buf + 8));
  poVar7 = std::operator<<(poVar7,"Handler);");
  poVar7 = std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_4f8,(t_generator *)this);
  poVar7 = std::operator<<(poVar7,(string *)&local_4f8);
  poVar7 = std::operator<<(poVar7,"  // Your initialization goes here");
  poVar7 = std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_518,(t_generator *)this);
  poVar7 = std::operator<<(poVar7,(string *)&local_518);
  poVar7 = std::operator<<(poVar7,"}");
  std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_518);
  std::__cxx11::string::~string((string *)&local_4f8);
  std::__cxx11::string::~string((string *)&local_4d8);
  std::__cxx11::string::~string((string *)&local_4b8);
  t_generator::indent_abi_cxx11_(&local_538,(t_generator *)this);
  poVar7 = std::operator<<((ostream *)local_2b0,(string *)&local_538);
  poVar7 = std::operator<<(poVar7,"virtual ~");
  poVar7 = std::operator<<(poVar7,(string *)
                                  &(this->super_t_oop_generator).super_t_generator.service_name_);
  poVar7 = std::operator<<(poVar7,"AsyncHandler();");
  std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_538);
  local_540 = (t_function **)
              std::vector<t_function_*,_std::allocator<t_function_*>_>::begin
                        ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter);
  local_398._M_current = local_540;
  while( true ) {
    local_548._M_current =
         (t_function **)
         std::vector<t_function_*,_std::allocator<t_function_*>_>::end
                   ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter);
    bVar2 = __gnu_cxx::operator!=(&local_398,&local_548);
    if (!bVar2) break;
    poVar7 = std::operator<<((ostream *)local_2b0,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_568,(t_generator *)this);
    poVar7 = std::operator<<(poVar7,(string *)&local_568);
    pptVar11 = __gnu_cxx::
               __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
               ::operator*(&local_398);
    ptVar1 = *pptVar11;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_5a8,"CobSv",&local_5a9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_5d0,"",(allocator *)((long)&returntype + 7));
    function_signature(&local_588,this,ptVar1,&local_5a8,&local_5d0,true);
    poVar7 = std::operator<<(poVar7,(string *)&local_588);
    poVar7 = std::operator<<(poVar7," {");
    std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_588);
    std::__cxx11::string::~string((string *)&local_5d0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&returntype + 7));
    std::__cxx11::string::~string((string *)&local_5a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_5a9);
    std::__cxx11::string::~string((string *)&local_568);
    t_generator::indent_up((t_generator *)this);
    pptVar11 = __gnu_cxx::
               __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
               ::operator*(&local_398);
    type = t_function::get_returntype(*pptVar11);
    returnfield._168_8_ = type;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_6b0,"_return",(allocator *)(target.field_2._M_local_buf + 0xf));
    t_field::t_field((t_field *)local_690,type,&local_6b0);
    std::__cxx11::string::~string((string *)&local_6b0);
    std::allocator<char>::~allocator((allocator<char> *)(target.field_2._M_local_buf + 0xf));
    bVar3 = (**(code **)(*(long *)returnfield._168_8_ + 0x20))();
    pcVar6 = "_return";
    if ((bVar3 & 1) != 0) {
      pcVar6 = "";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_6d8,pcVar6,&local_6d9);
    std::allocator<char>::~allocator((allocator<char> *)&local_6d9);
    bVar3 = (**(code **)(*(long *)returnfield._168_8_ + 0x20))();
    if ((bVar3 & 1) == 0) {
      t_generator::indent_abi_cxx11_(&local_700,(t_generator *)this);
      poVar7 = std::operator<<((ostream *)local_2b0,(string *)&local_700);
      declare_field_abi_cxx11_(&local_720,this,(t_field *)local_690,true,false,false,false);
      poVar7 = std::operator<<(poVar7,(string *)&local_720);
      std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_720);
      std::__cxx11::string::~string((string *)&local_700);
    }
    pptVar11 = __gnu_cxx::
               __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
               ::operator*(&local_398);
    ptVar1 = *pptVar11;
    std::__cxx11::string::string((string *)&local_740,local_6d8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_760,"syncHandler_",&local_761);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_788,"",&local_789);
    generate_function_call(this,(ostream *)local_2b0,ptVar1,&local_740,&local_760,&local_788);
    std::__cxx11::string::~string((string *)&local_788);
    std::allocator<char>::~allocator((allocator<char> *)&local_789);
    std::__cxx11::string::~string((string *)&local_760);
    std::allocator<char>::~allocator((allocator<char> *)&local_761);
    std::__cxx11::string::~string((string *)&local_740);
    t_generator::indent_abi_cxx11_(&local_7b0,(t_generator *)this);
    poVar7 = std::operator<<((ostream *)local_2b0,(string *)&local_7b0);
    poVar7 = std::operator<<(poVar7,"return cob(");
    poVar7 = std::operator<<(poVar7,local_6d8);
    poVar7 = std::operator<<(poVar7,");");
    std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_7b0);
    t_oop_generator::scope_down(&this->super_t_oop_generator,(ostream *)local_2b0);
    std::__cxx11::string::~string(local_6d8);
    t_field::~t_field((t_field *)local_690);
    __gnu_cxx::
    __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>::
    operator++(&local_398);
  }
  poVar7 = std::operator<<((ostream *)local_2b0,(string *)&::endl_abi_cxx11_);
  poVar7 = std::operator<<(poVar7," protected:");
  poVar7 = std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_7d0,(t_generator *)this);
  poVar7 = std::operator<<(poVar7,(string *)&local_7d0);
  poVar7 = std::operator<<(poVar7,"std::unique_ptr<");
  poVar7 = std::operator<<(poVar7,(string *)(f_skeleton_name.field_2._M_local_buf + 8));
  poVar7 = std::operator<<(poVar7,"Handler> syncHandler_;");
  std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_7d0);
  t_generator::indent_down((t_generator *)this);
  poVar7 = std::operator<<((ostream *)local_2b0,"};");
  poVar7 = std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_7f0,(t_generator *)this);
  poVar7 = std::operator<<((ostream *)local_2b0,(string *)&local_7f0);
  poVar7 = std::operator<<(poVar7,"int main(int argc, char **argv) {");
  std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_7f0);
  t_generator::indent_up((t_generator *)this);
  t_generator::indent_abi_cxx11_(&local_810,(t_generator *)this);
  poVar7 = std::operator<<((ostream *)local_2b0,(string *)&local_810);
  poVar7 = std::operator<<(poVar7,"int port = 9090;");
  poVar7 = std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_830,(t_generator *)this);
  poVar7 = std::operator<<(poVar7,(string *)&local_830);
  poVar7 = std::operator<<(poVar7,"::std::shared_ptr<");
  poVar7 = std::operator<<(poVar7,(string *)(f_skeleton_name.field_2._M_local_buf + 8));
  poVar7 = std::operator<<(poVar7,"AsyncHandler> handler(new ");
  poVar7 = std::operator<<(poVar7,(string *)(f_skeleton_name.field_2._M_local_buf + 8));
  poVar7 = std::operator<<(poVar7,"AsyncHandler());");
  poVar7 = std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_850,(t_generator *)this);
  poVar7 = std::operator<<(poVar7,(string *)&local_850);
  poVar7 = std::operator<<(poVar7,"::std::shared_ptr<");
  poVar7 = std::operator<<(poVar7,(string *)(f_skeleton_name.field_2._M_local_buf + 8));
  poVar7 = std::operator<<(poVar7,"AsyncProcessor> processor(new ");
  poVar7 = std::operator<<(poVar7,(string *)(f_skeleton_name.field_2._M_local_buf + 8));
  poVar7 = std::operator<<(poVar7,"AsyncProcessor(handler));");
  poVar7 = std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_870,(t_generator *)this);
  poVar7 = std::operator<<(poVar7,(string *)&local_870);
  poVar7 = std::operator<<(poVar7,
                           "::std::shared_ptr<TProtocolFactory> protocolFactory(new TBinaryProtocolFactory());"
                          );
  poVar7 = std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_890,(t_generator *)this);
  poVar7 = std::operator<<(poVar7,(string *)&local_890);
  poVar7 = std::operator<<(poVar7,
                           "::std::shared_ptr<TAsyncProtocolProcessor> protocolProcessor(new TAsyncProtocolProcessor(processor, protocolFactory));"
                          );
  poVar7 = std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
  poVar7 = std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_8b0,(t_generator *)this);
  poVar7 = std::operator<<(poVar7,(string *)&local_8b0);
  poVar7 = std::operator<<(poVar7,"TEvhttpServer server(protocolProcessor, port);");
  poVar7 = std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_8d0,(t_generator *)this);
  poVar7 = std::operator<<(poVar7,(string *)&local_8d0);
  poVar7 = std::operator<<(poVar7,"server.serve();");
  poVar7 = std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_8f0,(t_generator *)this);
  poVar7 = std::operator<<(poVar7,(string *)&local_8f0);
  poVar7 = std::operator<<(poVar7,"return 0;");
  std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_8f0);
  std::__cxx11::string::~string((string *)&local_8d0);
  std::__cxx11::string::~string((string *)&local_8b0);
  std::__cxx11::string::~string((string *)&local_890);
  std::__cxx11::string::~string((string *)&local_870);
  std::__cxx11::string::~string((string *)&local_850);
  std::__cxx11::string::~string((string *)&local_830);
  std::__cxx11::string::~string((string *)&local_810);
  t_generator::indent_down((t_generator *)this);
  poVar7 = std::operator<<((ostream *)local_2b0,"}");
  poVar7 = std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
  std::vector<t_function_*,_std::allocator<t_function_*>_>::~vector
            ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
  ~template_ofstream_with_content_based_conditional_update
            ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
              *)local_2b0);
  std::__cxx11::string::~string((string *)local_c8);
  std::__cxx11::string::~string((string *)local_58);
  std::__cxx11::string::~string((string *)(f_skeleton_name.field_2._M_local_buf + 8));
  return;
}

Assistant:

void t_cpp_generator::generate_service_async_skeleton(t_service* tservice) {
  string svcname = tservice->get_name();

  // Service implementation file includes
  string f_skeleton_name = get_out_dir() + svcname + "_async_server.skeleton.cpp";

  string ns = namespace_prefix(tservice->get_program()->get_namespace("cpp"));

  ofstream_with_content_based_conditional_update f_skeleton;
  f_skeleton.open(f_skeleton_name.c_str());
  f_skeleton << "// This autogenerated skeleton file illustrates one way to adapt a synchronous"
             << endl << "// interface into an asynchronous interface. You should copy it to another"
             << endl
             << "// filename to avoid overwriting it and rewrite as asynchronous any functions"
             << endl << "// that would otherwise introduce unwanted latency." << endl << endl
             << "#include \"" << get_include_prefix(*get_program()) << svcname << ".h\"" << endl
             << "#include <thrift/protocol/TBinaryProtocol.h>" << endl
             << "#include <thrift/async/TAsyncProtocolProcessor.h>" << endl
             << "#include <thrift/async/TEvhttpServer.h>" << endl
             << "#include <event.h>" << endl
             << "#include <evhttp.h>" << endl << endl
             << "using namespace ::apache::thrift;" << endl
             << "using namespace ::apache::thrift::protocol;" << endl
             << "using namespace ::apache::thrift::transport;" << endl
             << "using namespace ::apache::thrift::async;" << endl << endl;

  // the following code would not compile:
  // using namespace ;
  // using namespace ::;
  if ((!ns.empty()) && (ns.compare(" ::") != 0)) {
    f_skeleton << "using namespace " << string(ns, 0, ns.size() - 2) << ";" << endl << endl;
  }

  f_skeleton << "class " << svcname << "Handler : virtual public " << svcname << "If {" << endl
             << " public:" << endl;
  indent_up();
  f_skeleton << indent() << svcname << "Handler() {" << endl << indent()
             << "  // Your initialization goes here" << endl << indent() << "}" << endl << endl;

  vector<t_function*> functions = tservice->get_functions();
  vector<t_function*>::iterator f_iter;
  for (f_iter = functions.begin(); f_iter != functions.end(); ++f_iter) {
    generate_java_doc(f_skeleton, *f_iter);
    f_skeleton << indent() << function_signature(*f_iter, "") << " {" << endl << indent()
               << "  // Your implementation goes here" << endl << indent() << "  printf(\""
               << (*f_iter)->get_name() << "\\n\");" << endl << indent() << "}" << endl << endl;
  }

  indent_down();
  f_skeleton << "};" << endl << endl;

  f_skeleton << "class " << svcname << "AsyncHandler : "
             << "public " << svcname << "CobSvIf {" << endl << " public:" << endl;
  indent_up();
  f_skeleton << indent() << svcname << "AsyncHandler() {" << endl << indent()
             << "  syncHandler_ = std::unique_ptr<" << svcname << "Handler>(new " << svcname
             << "Handler);" << endl << indent() << "  // Your initialization goes here" << endl
             << indent() << "}" << endl;
  f_skeleton << indent() << "virtual ~" << service_name_ << "AsyncHandler();" << endl;

  for (f_iter = functions.begin(); f_iter != functions.end(); ++f_iter) {
    f_skeleton << endl << indent() << function_signature(*f_iter, "CobSv", "", true) << " {"
               << endl;
    indent_up();

    t_type* returntype = (*f_iter)->get_returntype();
    t_field returnfield(returntype, "_return");

    string target = returntype->is_void() ? "" : "_return";
    if (!returntype->is_void()) {
      f_skeleton << indent() << declare_field(&returnfield, true) << endl;
    }
    generate_function_call(f_skeleton, *f_iter, target, "syncHandler_", "");
    f_skeleton << indent() << "return cob(" << target << ");" << endl;

    scope_down(f_skeleton);
  }
  f_skeleton << endl << " protected:" << endl << indent() << "std::unique_ptr<" << svcname
             << "Handler> syncHandler_;" << endl;
  indent_down();
  f_skeleton << "};" << endl << endl;

  f_skeleton << indent() << "int main(int argc, char **argv) {" << endl;
  indent_up();
  f_skeleton
      << indent() << "int port = 9090;" << endl << indent() << "::std::shared_ptr<" << svcname
      << "AsyncHandler> handler(new " << svcname << "AsyncHandler());" << endl << indent()
      << "::std::shared_ptr<" << svcname << "AsyncProcessor> processor(new " << svcname << "AsyncProcessor(handler));" << endl
      << indent() << "::std::shared_ptr<TProtocolFactory> protocolFactory(new TBinaryProtocolFactory());"
      << endl
      << indent() << "::std::shared_ptr<TAsyncProtocolProcessor> protocolProcessor(new TAsyncProtocolProcessor(processor, protocolFactory));"
      << endl << endl << indent()
      << "TEvhttpServer server(protocolProcessor, port);"
      << endl << indent() << "server.serve();" << endl << indent() << "return 0;" << endl;
  indent_down();
  f_skeleton << "}" << endl << endl;
}